

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::ModuleHeaderSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((kind != InterfaceHeader) && (kind != ModuleHeader)) && (kind != PackageHeader)) &&
     (kind != ProgramHeader)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ModuleHeaderSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::InterfaceHeader:
        case SyntaxKind::ModuleHeader:
        case SyntaxKind::PackageHeader:
        case SyntaxKind::ProgramHeader:
            return true;
        default:
            return false;
    }
}